

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::queryCacheSizes_intel(int *l1,int *l2,int *l3,int max_std_funcs)

{
  int max_std_funcs_local;
  int *l3_local;
  int *l2_local;
  int *l1_local;
  
  if (max_std_funcs < 4) {
    if (max_std_funcs < 2) {
      *l3 = 0;
      *l2 = 0;
      *l1 = 0;
    }
    else {
      queryCacheSizes_intel_codes(l1,l2,l3);
    }
  }
  else {
    queryCacheSizes_intel_direct(l1,l2,l3);
  }
  return;
}

Assistant:

inline void queryCacheSizes_intel(int& l1, int& l2, int& l3, int max_std_funcs)
{
  if(max_std_funcs>=4)
    queryCacheSizes_intel_direct(l1,l2,l3);
  else if(max_std_funcs>=2)
    queryCacheSizes_intel_codes(l1,l2,l3);
  else
    l1 = l2 = l3 = 0;
}